

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O2

void microatf_fail_require(char *msg,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar1;
  undefined8 in_RSI;
  __va_list_tag *in_R8;
  undefined8 in_R9;
  ulong uVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_b8 [8];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  __va_list_tag *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_b0 = in_RSI;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  if (microatf_context_static.expect == MICROATF_EXPECT_PASS) {
    args[0].reg_save_area = local_b8;
    args[0].overflow_arg_area = &stack0x00000008;
    args[0].gp_offset = 8;
    args[0].fp_offset = 0x30;
    iVar1 = -1;
    microatf_context_write_result_pack
              ((microatf_context_t *)0x10312e,(char *)0xffffffffffffffff,(int)msg,(char *)args,in_R8
              );
  }
  else {
    if (microatf_context_static.expect == MICROATF_EXPECT_FAIL) {
      args[0].reg_save_area = local_b8;
      args[0].overflow_arg_area = &stack0x00000008;
      args[0].gp_offset = 8;
      args[0].fp_offset = 0x30;
      iVar1 = -1;
      microatf_context_write_result_pack
                ((microatf_context_t *)"expected_failure",(char *)0xffffffffffffffff,(int)msg,
                 (char *)args,in_R8);
      microatf_context_exit((microatf_context_t *)0x0,iVar1);
    }
    args[0].reg_save_area = local_b8;
    args[0].overflow_arg_area = &stack0x00000008;
    args[0].gp_offset = 0x18;
    args[0].fp_offset = 0x30;
    uVar2 = (ulong)(uint)local_a8;
    iVar1 = 0x10312e;
    microatf_context_write_result
              ((microatf_context_t *)msg,"failed",(int)args[0].reg_save_area,"%s:%d: %s",in_RSI,
               uVar2,"Test case raised a failure but was not expecting one");
  }
  microatf_context_exit((microatf_context_t *)0x1,iVar1);
}

Assistant:

void
microatf_fail_require(char const *msg, ...)
{
	microatf_context_t *context = microatf_context;

	if (context->expect == MICROATF_EXPECT_FAIL) {
		va_list args;
		va_start(args, msg);
		microatf_context_write_result_pack(context, /**/
		    "expected_failure", -1, msg, args);
		va_end(args);

		microatf_context_exit(context, EXIT_SUCCESS);
	} else if (context->expect == MICROATF_EXPECT_PASS) {
		va_list args;
		va_start(args, msg);
		microatf_context_write_result_pack(context, /**/
		    "failed", -1, msg, args);
		va_end(args);

		microatf_context_exit(context, EXIT_FAILURE);
	} else {
		va_list args;
		va_start(args, msg);
		char const *file = va_arg(args, char const *);
		int line = va_arg(args, int);
		microatf_context_write_result(context, "failed", -1,
		    "%s:%d: %s", file, line,
		    "Test case raised a failure but was not expecting one");
		va_end(args);

		microatf_context_exit(context, EXIT_FAILURE);
	}
}